

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::BasicTexImage2DArrayCase::createTexture(BasicTexImage2DArrayCase *this)

{
  int depth;
  deUint32 dVar1;
  int width;
  int height;
  char *str;
  TransferFormat TVar2;
  void *data;
  PixelBufferAccess local_100;
  PixelBufferAccess local_d8;
  undefined1 local_ac [8];
  Vec4 gMax;
  Vec4 gMin;
  int levelH;
  int levelW;
  int ndx;
  undefined1 local_78 [8];
  TextureLevel levelData;
  deUint32 local_34;
  deUint32 dStack_30;
  TransferFormat transferFmt;
  Random rnd;
  deUint32 tex;
  BasicTexImage2DArrayCase *this_local;
  
  rnd.m_rnd.z = 0;
  unique0x10000469 = this;
  str = tcu::TestNode::getName((TestNode *)this);
  dVar1 = deStringHash(str);
  de::Random::Random((Random *)&transferFmt,dVar1);
  TVar2 = glu::getTransferFormat((this->super_Texture2DArraySpecCase).m_texFormat);
  local_34 = TVar2.format;
  dStack_30 = TVar2.dataType;
  _levelW = glu::mapGLTransferFormat(local_34,dStack_30);
  tcu::TextureLevel::TextureLevel((TextureLevel *)local_78,(TextureFormat *)&levelW);
  sglr::ContextWrapper::glGenTextures
            (&(this->super_Texture2DArraySpecCase).super_TextureSpecCase.super_ContextWrapper,1,
             &rnd.m_rnd.z);
  sglr::ContextWrapper::glBindTexture
            (&(this->super_Texture2DArraySpecCase).super_TextureSpecCase.super_ContextWrapper,0x8c1a
             ,rnd.m_rnd.z);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_Texture2DArraySpecCase).super_TextureSpecCase.super_ContextWrapper,0xcf5,
             1);
  for (levelH = 0; levelH < (this->super_Texture2DArraySpecCase).m_numLevels; levelH = levelH + 1) {
    width = de::max<int>(1,(this->super_Texture2DArraySpecCase).m_width >> ((byte)levelH & 0x1f));
    height = de::max<int>(1,(this->super_Texture2DArraySpecCase).m_height >> ((byte)levelH & 0x1f));
    randomVector<4>((Functional *)(gMax.m_data + 2),(Random *)&transferFmt,
                    &(this->super_Texture2DArraySpecCase).m_texFormatInfo.valueMin,
                    &(this->super_Texture2DArraySpecCase).m_texFormatInfo.valueMax);
    randomVector<4>((Functional *)local_ac,(Random *)&transferFmt,
                    &(this->super_Texture2DArraySpecCase).m_texFormatInfo.valueMin,
                    &(this->super_Texture2DArraySpecCase).m_texFormatInfo.valueMax);
    tcu::TextureLevel::setSize
              ((TextureLevel *)local_78,width,height,
               (this->super_Texture2DArraySpecCase).m_numLayers);
    tcu::TextureLevel::getAccess(&local_d8,(TextureLevel *)local_78);
    tcu::fillWithComponentGradients(&local_d8,(Vec4 *)(gMax.m_data + 2),(Vec4 *)local_ac);
    depth = (this->super_Texture2DArraySpecCase).m_numLayers;
    dVar1 = this->m_internalFormat;
    tcu::TextureLevel::getAccess(&local_100,(TextureLevel *)local_78);
    data = tcu::PixelBufferAccess::getDataPtr(&local_100);
    sglr::ContextWrapper::glTexImage3D
              (&(this->super_Texture2DArraySpecCase).super_TextureSpecCase.super_ContextWrapper,
               0x8c1a,levelH,dVar1,width,height,depth,0,local_34,dStack_30,data);
  }
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_78);
  de::Random::~Random((Random *)&transferFmt);
  return;
}

Assistant:

void createTexture (void)
	{
		deUint32				tex			= 0;
		de::Random				rnd			(deStringHash(getName()));
		glu::TransferFormat		transferFmt	= glu::getTransferFormat(m_texFormat);
		tcu::TextureLevel		levelData	(glu::mapGLTransferFormat(transferFmt.format, transferFmt.dataType));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D_ARRAY, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width	>> ndx);
			int		levelH		= de::max(1, m_height	>> ndx);
			Vec4	gMin		= randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);
			Vec4	gMax		= randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);

			levelData.setSize(levelW, levelH, m_numLayers);
			tcu::fillWithComponentGradients(levelData.getAccess(), gMin, gMax);

			glTexImage3D(GL_TEXTURE_2D_ARRAY, ndx, m_internalFormat, levelW, levelH, m_numLayers, 0, transferFmt.format, transferFmt.dataType, levelData.getAccess().getDataPtr());
		}
	}